

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::memory::anon_unknown_0::AllocateFreeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,AllocateFreeTestInstance *this)

{
  deUint32 *value;
  void **ppvVar1;
  Order OVar2;
  Context *this_00;
  TestLog *pTVar3;
  unsigned_long *value_00;
  ulong *puVar4;
  VkResult VVar5;
  uint uVar6;
  qpTestResult qVar7;
  VkDevice pVVar8;
  DeviceInterface *pDVar9;
  MessageBuilder *pMVar10;
  ulong uVar11;
  TestError *pTVar12;
  NotSupportedError *this_01;
  size_t ndx;
  ulong uVar13;
  long lVar14;
  size_t ndx_1;
  float fVar15;
  allocator_type local_221;
  ulong local_220;
  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
  memoryObjects;
  VkMemoryType memoryType;
  VkMemoryHeap memoryHeap;
  string local_1d0;
  VkMemoryAllocateInfo alloc;
  
  this_00 = (this->super_TestInstance).m_context;
  pTVar3 = this_00->m_testCtx->m_log;
  pVVar8 = Context::getDevice(this_00);
  pDVar9 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  if (this->m_memoryTypeIndex == 0) {
    ppvVar1 = &alloc.pNext;
    alloc._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
    std::operator<<((ostream *)ppvVar1,"Memory allocation count: ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&alloc,&(this->m_config).memoryAllocationCount);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    ppvVar1 = &alloc.pNext;
    alloc._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
    std::operator<<((ostream *)ppvVar1,"Single allocation size: ");
    value_00 = (this->m_config).memorySize.m_ptr;
    if (value_00 == (unsigned_long *)0x0) {
      memoryHeap.size =
           CONCAT44(memoryHeap.size._4_4_,*(this->m_config).memoryPercentage.m_ptr * 100.0);
      de::toString<float>(&local_1d0,(float *)&memoryHeap);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &memoryObjects,&local_1d0," percent of the heap size.");
    }
    else {
      de::toString<unsigned_long>((string *)&memoryObjects,value_00);
    }
    std::operator<<((ostream *)ppvVar1,(string *)&memoryObjects);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&memoryObjects);
    if (value_00 == (unsigned_long *)0x0) {
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    OVar2 = (this->m_config).order;
    if (OVar2 == ALLOC_FREE) {
      alloc._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc.pNext);
      std::operator<<((ostream *)&alloc.pNext,"Memory is freed in same order as allocated. ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else if (OVar2 == MIXED_ALLOC_FREE) {
      alloc._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc.pNext);
      std::operator<<((ostream *)&alloc.pNext,"Memory is freed right after allocation. ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (OVar2 != ALLOC_REVERSE_FREE) goto LAB_0063b6f1;
      alloc._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc.pNext);
      std::operator<<((ostream *)&alloc.pNext,"Memory is freed in reversed order. ");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&alloc.pNext);
  }
LAB_0063b6f1:
  memoryType = (this->m_memoryProperties).memoryTypes[this->m_memoryTypeIndex];
  puVar4 = (ulong *)((long)&(this->m_memoryProperties).memoryHeaps[0].size +
                    ((ulong)memoryType >> 0x1c & 0xfffffffffffffff0));
  memoryHeap.size = *puVar4;
  memoryHeap._8_8_ = puVar4[1];
  puVar4 = (this->m_config).memorySize.m_ptr;
  if (puVar4 == (ulong *)0x0) {
    fVar15 = (float)memoryHeap.size * *(this->m_config).memoryPercentage.m_ptr;
    local_220 = (ulong)fVar15;
    local_220 = (long)(fVar15 - 9.223372e+18) & (long)local_220 >> 0x3f | local_220;
  }
  else {
    local_220 = *puVar4;
  }
  alloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  alloc._4_4_ = 0;
  std::vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>::
  vector(&memoryObjects,(ulong)(this->m_config).memoryAllocationCount,(value_type *)&alloc,
         &local_221);
  ppvVar1 = &alloc.pNext;
  alloc._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
  std::operator<<((ostream *)ppvVar1,"Memory type index: ");
  value = &this->m_memoryTypeIndex;
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&alloc,value);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
  if ((this->m_memoryProperties).memoryHeapCount <= memoryType.heapIndex) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&alloc,"Invalid heap index defined for memory type.",
               (allocator<char> *)&local_221);
    tcu::ResultCollector::fail(&this->m_result,(string *)&alloc);
    std::__cxx11::string::~string((string *)&alloc);
  }
  ppvVar1 = &alloc.pNext;
  alloc._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
  std::operator<<((ostream *)ppvVar1,"Memory type: ");
  ::vk::operator<<((ostream *)ppvVar1,&memoryType);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
  ppvVar1 = &alloc.pNext;
  alloc._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
  std::operator<<((ostream *)ppvVar1,"Memory heap: ");
  ::vk::operator<<((ostream *)ppvVar1,&memoryHeap);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&alloc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
  uVar11 = (ulong)(this->m_config).memoryAllocationCount;
  if (local_220 * uVar11 * 8 <= memoryHeap.size) {
    if ((this->m_config).order < MIXED_ALLOC_FREE) {
      lVar14 = 0;
      for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
        alloc.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
        alloc.pNext = (void *)0x0;
        alloc.allocationSize = local_220;
        alloc.memoryTypeIndex = *value;
        VVar5 = (*pDVar9->_vptr_DeviceInterface[5])
                          (pDVar9,pVVar8,&alloc,0,
                           (long)&(memoryObjects.
                                   super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_internal + lVar14);
        ::vk::checkResult(VVar5,
                          "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                          ,0xa8);
        if (*(long *)((long)&(memoryObjects.
                              super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_internal + lVar14) == 0)
        {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar12,(char *)0x0,"!!memoryObjects[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                     ,0xaa);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar11 = (ulong)(this->m_config).memoryAllocationCount;
        lVar14 = lVar14 + 8;
      }
      if ((this->m_config).order == ALLOC_FREE) {
        lVar14 = -8;
        for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
          (*pDVar9->_vptr_DeviceInterface[6])
                    (pDVar9,pVVar8,
                     *(undefined8 *)
                      ((long)&(memoryObjects.
                               super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->m_internal + lVar14),0);
          *(undefined8 *)
           ((long)&(memoryObjects.
                    super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->m_internal + lVar14) = 0;
          uVar11 = (ulong)(this->m_config).memoryAllocationCount;
          lVar14 = lVar14 + -8;
        }
      }
      else {
        for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
          (*pDVar9->_vptr_DeviceInterface[6])
                    (pDVar9,pVVar8,
                     memoryObjects.
                     super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].m_internal,0);
          memoryObjects.
          super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar13].m_internal = 0;
          uVar11 = (ulong)(this->m_config).memoryAllocationCount;
        }
      }
    }
    else {
      lVar14 = 0;
      for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
        alloc.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
        alloc.pNext = (void *)0x0;
        alloc.allocationSize = local_220;
        alloc.memoryTypeIndex = *value;
        VVar5 = (*pDVar9->_vptr_DeviceInterface[5])
                          (pDVar9,pVVar8,&alloc,0,
                           (long)&(memoryObjects.
                                   super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_internal + lVar14);
        ::vk::checkResult(VVar5,
                          "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                          ,0xce);
        if (*(long *)((long)&(memoryObjects.
                              super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_internal + lVar14) == 0)
        {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar12,(char *)0x0,"!!memoryObjects[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                     ,0xcf);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*pDVar9->_vptr_DeviceInterface[6])(pDVar9,pVVar8);
        *(undefined8 *)
         ((long)&(memoryObjects.
                  super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_internal + lVar14) = 0;
        uVar11 = (ulong)(this->m_config).memoryAllocationCount;
        lVar14 = lVar14 + 8;
      }
    }
    std::
    _Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>::
    ~_Vector_base(&memoryObjects.
                   super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                 );
    uVar6 = this->m_memoryTypeIndex + 1;
    this->m_memoryTypeIndex = uVar6;
    if (uVar6 < (this->m_memoryProperties).memoryTypeCount) {
      tcu::TestStatus::incomplete();
    }
    else {
      qVar7 = tcu::ResultCollector::getResult(&this->m_result);
      std::__cxx11::string::string((string *)&alloc,(string *)&(this->m_result).m_message);
      __return_storage_ptr__->m_code = qVar7;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_description,(string *)&alloc);
      std::__cxx11::string::~string((string *)&alloc);
    }
    return __return_storage_ptr__;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Memory heap doesn\'t have enough memory.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
             ,0x98);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus AllocateFreeTestInstance::iterate (void)
{
	TestLog&								log					= m_context.getTestContext().getLog();
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	DE_ASSERT(m_config.memoryAllocationCount <= MAX_ALLOCATION_COUNT);

	if (m_memoryTypeIndex == 0)
	{
		log << TestLog::Message << "Memory allocation count: " << m_config.memoryAllocationCount << TestLog::EndMessage;
		log << TestLog::Message << "Single allocation size: " << (m_config.memorySize ? de::toString(*m_config.memorySize) : de::toString(100.0f * (*m_config.memoryPercentage)) + " percent of the heap size.") << TestLog::EndMessage;

		if (m_config.order == TestConfig::ALLOC_REVERSE_FREE)
			log << TestLog::Message << "Memory is freed in reversed order. " << TestLog::EndMessage;
		else if (m_config.order == TestConfig::ALLOC_FREE)
			log << TestLog::Message << "Memory is freed in same order as allocated. " << TestLog::EndMessage;
		else if (m_config.order == TestConfig::MIXED_ALLOC_FREE)
			log << TestLog::Message << "Memory is freed right after allocation. " << TestLog::EndMessage;
		else
			DE_FATAL("Unknown allocation order");
	}

	try
	{
		const VkMemoryType		memoryType		= m_memoryProperties.memoryTypes[m_memoryTypeIndex];
		const VkMemoryHeap		memoryHeap		= m_memoryProperties.memoryHeaps[memoryType.heapIndex];

		const VkDeviceSize		allocationSize	= (m_config.memorySize ? *m_config.memorySize : (VkDeviceSize)(*m_config.memoryPercentage * (float)memoryHeap.size));
		vector<VkDeviceMemory>	memoryObjects	(m_config.memoryAllocationCount, (VkDeviceMemory)0);

		log << TestLog::Message << "Memory type index: " << m_memoryTypeIndex << TestLog::EndMessage;

		if (memoryType.heapIndex >= m_memoryProperties.memoryHeapCount)
			m_result.fail("Invalid heap index defined for memory type.");

		{
			log << TestLog::Message << "Memory type: " << memoryType << TestLog::EndMessage;
			log << TestLog::Message << "Memory heap: " << memoryHeap << TestLog::EndMessage;

			if (allocationSize * m_config.memoryAllocationCount * 8 > memoryHeap.size)
				TCU_THROW(NotSupportedError, "Memory heap doesn't have enough memory.");

			try
			{
				if (m_config.order == TestConfig::ALLOC_FREE || m_config.order == TestConfig::ALLOC_REVERSE_FREE)
				{
					for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
					{
						const VkMemoryAllocateInfo alloc =
						{
							VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
							DE_NULL,								// pNext
							allocationSize,							// allocationSize
							m_memoryTypeIndex						// memoryTypeIndex;
						};

						VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx]));

						TCU_CHECK(!!memoryObjects[ndx]);
					}

					if (m_config.order == TestConfig::ALLOC_FREE)
					{
						for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
						{
							const VkDeviceMemory mem = memoryObjects[memoryObjects.size() - 1 - ndx];

							vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
							memoryObjects[memoryObjects.size() - 1 - ndx] = (VkDeviceMemory)0;
						}
					}
					else
					{
						for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
						{
							const VkDeviceMemory mem = memoryObjects[ndx];

							vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
							memoryObjects[ndx] = (VkDeviceMemory)0;
						}
					}
				}
				else
				{
					for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
					{
						const VkMemoryAllocateInfo alloc =
						{
							VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
							DE_NULL,								// pNext
							allocationSize,							// allocationSize
							m_memoryTypeIndex						// memoryTypeIndex;
						};

						VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx]));
						TCU_CHECK(!!memoryObjects[ndx]);

						vkd.freeMemory(device, memoryObjects[ndx], (const VkAllocationCallbacks*)DE_NULL);
						memoryObjects[ndx] = (VkDeviceMemory)0;
					}
				}
			}
			catch (...)
			{
				for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
				{
					const VkDeviceMemory mem = memoryObjects[ndx];

					if (!!mem)
					{
						vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
						memoryObjects[ndx] = (VkDeviceMemory)0;
					}
				}

				throw;
			}
		}
	}
	catch (const tcu::TestError& error)
	{
		m_result.fail(error.getMessage());
	}

	m_memoryTypeIndex++;

	if (m_memoryTypeIndex < m_memoryProperties.memoryTypeCount)
		return tcu::TestStatus::incomplete();
	else
		return tcu::TestStatus(m_result.getResult(), m_result.getMessage());
}